

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

void __thiscall pybind11::detail::internals::~internals(internals *this)

{
  internals *this_local;
  
  PyThread_tss_free(this->tstate);
  std::
  forward_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~forward_list(&this->static_strings);
  std::vector<_object_*,_std::allocator<_object_*>_>::~vector(&this->loader_patient_stack);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::~unordered_map(&this->shared_data);
  std::
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  ::~forward_list(&this->registered_exception_translators);
  std::
  unordered_map<const__object_*,_std::vector<_object_*,_std::allocator<_object_*>_>,_std::hash<const__object_*>,_std::equal_to<const__object_*>,_std::allocator<std::pair<const__object_*const,_std::vector<_object_*,_std::allocator<_object_*>_>_>_>_>
  ::~unordered_map(&this->patients);
  std::
  unordered_map<std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::vector<bool_(*)(_object_*,_void_*&),_std::allocator<bool_(*)(_object_*,_void_*&)>_>_>_>_>
  ::~unordered_map(&this->direct_conversions);
  std::
  unordered_set<std::pair<const__object_*,_const_char_*>,_pybind11::detail::overload_hash,_std::equal_to<std::pair<const__object_*,_const_char_*>_>,_std::allocator<std::pair<const__object_*,_const_char_*>_>_>
  ::~unordered_set(&this->inactive_overload_cache);
  std::
  unordered_multimap<const_void_*,_pybind11::detail::instance_*,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_pybind11::detail::instance_*>_>_>
  ::~unordered_multimap(&this->registered_instances);
  std::
  unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
  ::~unordered_map(&this->registered_types_py);
  std::
  unordered_map<std::type_index,_pybind11::detail::type_info_*,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_pybind11::detail::type_info_*>_>_>
  ::~unordered_map(&this->registered_types_cpp);
  return;
}

Assistant:

~internals() {
        // This destructor is called *after* Py_Finalize() in finalize_interpreter().
        // That *SHOULD BE* fine. The following details what happens whe PyThread_tss_free is called.
        // PYBIND11_TLS_FREE is PyThread_tss_free on python 3.7+. On older python, it does nothing.
        // PyThread_tss_free calls PyThread_tss_delete and PyMem_RawFree.
        // PyThread_tss_delete just calls TlsFree (on Windows) or pthread_key_delete (on *NIX). Neither
        // of those have anything to do with CPython internals.
        // PyMem_RawFree *requires* that the `tstate` be allocated with the CPython allocator.
        PYBIND11_TLS_FREE(tstate);
    }